

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O1

void __thiscall
duckdb::WriteAheadLogDeserializer::ReplayCreateTableMacro(WriteAheadLogDeserializer *this)

{
  BinaryDeserializer *deserializer;
  ClientContext *context;
  Catalog *this_00;
  int iVar1;
  CreateFunctionInfo *info;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> entry;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_20;
  CreateInfo *local_18;
  
  deserializer = &this->deserializer;
  (*(this->deserializer).super_Deserializer._vptr_Deserializer[2])(deserializer,0x65,"table_macro");
  local_20._M_head_impl = (CreateInfo *)0x0;
  iVar1 = (*(this->deserializer).super_Deserializer._vptr_Deserializer[10])(deserializer);
  if ((char)iVar1 != '\0') {
    (*(deserializer->super_Deserializer)._vptr_Deserializer[6])(deserializer);
    CreateInfo::Deserialize
              ((CreateInfo *)&stack0xffffffffffffffe8,&deserializer->super_Deserializer);
    local_20._M_head_impl = local_18;
    (*(deserializer->super_Deserializer)._vptr_Deserializer[7])(deserializer);
  }
  (*(deserializer->super_Deserializer)._vptr_Deserializer[0xb])(deserializer);
  (*(deserializer->super_Deserializer)._vptr_Deserializer[3])(deserializer);
  if (this->deserialize_only == false) {
    context = this->context;
    this_00 = this->catalog;
    info = (CreateFunctionInfo *)
           unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)&local_20);
    Catalog::CreateFunction(this_00,context,info);
  }
  if (local_20._M_head_impl != (CreateInfo *)0x0) {
    (*((local_20._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayCreateTableMacro() {
	auto entry = deserializer.ReadProperty<unique_ptr<CreateInfo>>(101, "table_macro");
	if (DeserializeOnly()) {
		return;
	}
	catalog.CreateFunction(context, entry->Cast<CreateMacroInfo>());
}